

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.c
# Opt level: O0

int main(void)

{
  _Bool _Var1;
  int iVar2;
  long local_48;
  size_t j;
  size_t i;
  buffers b;
  char *errmsg;
  int ret;
  
  errmsg._0_4_ = 0;
  b.encsz = 0;
  b.enc = (char *)sizes[0].len;
  b.regsz = (sizes[0].len * 5) / 3;
  i = (size_t)malloc(sizes[0].len);
  if ((void *)i == (void *)0x0) {
    b.encsz = (size_t)anon_var_dwarf_16a;
    errmsg._0_4_ = 1;
  }
  else {
    b.reg = (char *)malloc(b.regsz);
    if (b.reg == (char *)0x0) {
      b.encsz = (size_t)anon_var_dwarf_16a;
      errmsg._0_4_ = 1;
    }
    else {
      _Var1 = get_random_data((buffers *)&i,(char **)&b.encsz);
      if (_Var1) {
        for (j = 0; j < 5; j = j + 1) {
          printf("Testing with buffer size %s, fastest of %d * %d\n",sizes[j].label,
                 (ulong)(uint)sizes[j].repeat,(ulong)(uint)sizes[j].batch);
          for (local_48 = 0; codecs[local_48] != (char *)0x0; local_48 = local_48 + 1) {
            iVar2 = codec_supported(1 << ((byte)local_48 & 0x1f));
            if (iVar2 != 0) {
              codec_bench((buffers *)&i,sizes + j,codecs[local_48],1 << ((byte)local_48 & 0x1f));
            }
          }
        }
      }
      else {
        errmsg._0_4_ = 1;
      }
      free(b.reg);
    }
    free((void *)i);
  }
  if (b.encsz != 0) {
    fputs((char *)b.encsz,_stderr);
  }
  return (int)errmsg;
}

Assistant:

int
main ()
{
	int ret = 0;
	char *errmsg = NULL;
	struct buffers b;

	// Set buffer sizes to largest buffer length:
	b.regsz = sizes[0].len;
	b.encsz = sizes[0].len * 5 / 3;

	// Allocate space for megabytes of random data:
	if ((b.reg = malloc(b.regsz)) == NULL) {
		errmsg = "Out of memory";
		ret = 1;
		goto err0;
	}

	// Allocate space for encoded output:
	if ((b.enc = malloc(b.encsz)) == NULL) {
		errmsg = "Out of memory";
		ret = 1;
		goto err1;
	}

	// Fill buffer with random data:
	if (get_random_data(&b, &errmsg) == false) {
		ret = 1;
		goto err2;
	}

	// Loop over all buffer sizes:
	for (size_t i = 0; i < sizeof(sizes) / sizeof(sizes[0]); i++) {
		printf("Testing with buffer size %s, fastest of %d * %d\n",
			sizes[i].label, sizes[i].repeat, sizes[i].batch);

		// Loop over all codecs:
		for (size_t j = 0; codecs[j]; j++)
			if (codec_supported(1 << j))
				codec_bench(&b, &sizes[i], codecs[j], 1 << j);
	};

	// Free memory:
err2:	free(b.enc);
err1:	free(b.reg);
err0:	if (errmsg)
		fputs(errmsg, stderr);

	return ret;
}